

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

int pty_exitcode(Backend *be)

{
  uint uVar1;
  
  if (*(char *)((long)&be[-4].vt + 5) != '\x01') {
    return -1;
  }
  uVar1 = *(uint *)&be[-4].interactor & 0x7f;
  if (0x1ffffff < (int)(uVar1 * 0x1000000 + 0x1000000)) {
    return uVar1 | 0x80;
  }
  return *(uint *)&be[-4].interactor >> 8 & 0xff;
}

Assistant:

static int pty_exitcode(Backend *be)
{
    Pty *pty = container_of(be, Pty, backend);
    if (!pty->finished)
        return -1;                     /* not dead yet */
    else if (WIFSIGNALED(pty->exit_code))
        return 128 + WTERMSIG(pty->exit_code);
    else
        return WEXITSTATUS(pty->exit_code);
}